

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_read_one(sexp ctx,sexp in,sexp_conflict *shares)

{
  sexp psVar1;
  char *msg;
  
  psVar1 = sexp_read_raw(ctx,in,shares);
  if (psVar1 == (sexp)0x63e) {
    msg = "too many \')\'s";
  }
  else if (psVar1 == (sexp)0x73e) {
    msg = "unexpected \'.\'";
  }
  else {
    if (psVar1 != (sexp)0xc3e) {
      return psVar1;
    }
    msg = "too many \'}\'s";
  }
  psVar1 = sexp_read_error(ctx,msg,(sexp)&DAT_0000023e,in);
  return psVar1;
}

Assistant:

sexp sexp_read_one (sexp ctx, sexp in, sexp *shares) {
  sexp res = sexp_read_raw(ctx, in, shares);
  if (res == SEXP_CLOSE)
    res = sexp_read_error(ctx, "too many ')'s", SEXP_NULL, in);
#if SEXP_USE_OBJECT_BRACE_LITERALS
  else if (res == SEXP_CLOSE_BRACE)
    res = sexp_read_error(ctx, "too many '}'s", SEXP_NULL, in);
#endif
  else if (res == SEXP_RAWDOT)
    res = sexp_read_error(ctx, "unexpected '.'", SEXP_NULL, in);
  return res;
}